

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte bVar1;
  uchar uVar2;
  uchar *usbbuff;
  long ii;
  int *idata;
  int flagval;
  double zero_local;
  double scale_local;
  int nullval_local;
  void *nullflagval_local;
  int nullcheck_local;
  long tilelen_local;
  void *tiledata_local;
  fitsfile *outfptr_local;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    outfptr_local._4_4_ = 0x19d;
  }
  else {
    if (((outfptr->Fptr->compress_type == 0xb) || (outfptr->Fptr->compress_type == 0x15)) ||
       ((outfptr->Fptr->compress_type == 0x16 || (outfptr->Fptr->compress_type == 0x33)))) {
      *intlength = 1;
      if ((nullcheck == 1) && (bVar1 = *nullflagval, (uint)bVar1 != nullval)) {
        for (usbbuff = (uchar *)(tilelen + -1); -1 < (long)usbbuff; usbbuff = usbbuff + -1) {
          if ((uint)*(byte *)((long)tiledata + (long)usbbuff) == (uint)bVar1) {
            *(uchar *)((long)tiledata + (long)usbbuff) = (uchar)nullval;
          }
        }
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        uVar2 = *nullflagval;
        for (usbbuff = (uchar *)(tilelen + -1); -1 < (long)usbbuff; usbbuff = usbbuff + -1) {
          if (*(uchar *)((long)tiledata + (long)usbbuff) == uVar2) {
            *(int *)((long)tiledata + (long)usbbuff * 4) = nullval;
          }
          else {
            *(uint *)((long)tiledata + (long)usbbuff * 4) =
                 (uint)*(byte *)((long)tiledata + (long)usbbuff);
          }
        }
      }
      else {
        fits_ubyte_to_int_inplace((uchar *)tiledata,tilelen,status);
      }
    }
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_convert_tile_tbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    unsigned char *usbbuff;
        
       /* datatype of input array is unsigned byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != BYTE_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       usbbuff = (unsigned char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       usbbuff[ii] = (unsigned char) nullval;
                    }
               }
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) usbbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert usbbuff to an I*4 array, in place */
                 /* usbbuff must have been allocated large enough to do this */
                 fits_ubyte_to_int_inplace(usbbuff, tilelen, status);
           }
       }

       return(*status);
}